

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

int TextStartsWithWhitespace(Lexer *lexer,Node *node,uint start,uint mode)

{
  char cVar1;
  Bool BVar2;
  bool bVar3;
  uint local_30;
  uint ix;
  uint ch;
  uint mode_local;
  uint start_local;
  Node *node_local;
  Lexer *lexer_local;
  
  if (node == (Node *)0x0) {
    __assert_fail("node != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/pprint.c"
                  ,0x415,"int TextStartsWithWhitespace(Lexer *, Node *, uint, uint)");
  }
  if (((((mode & 0x12) != 0) && (BVar2 = prvTidynodeIsTextLike(node), BVar2 != no)) &&
      (node->start < node->end)) && (local_30 = start, node->start <= start)) {
    while( true ) {
      bVar3 = false;
      if (local_30 < node->end) {
        cVar1 = lexer->lexbuf[local_30];
        bVar3 = false;
        if (((cVar1 != '\0') && (bVar3 = true, cVar1 != ' ')) && (bVar3 = true, cVar1 != '\t')) {
          bVar3 = cVar1 == '\r';
        }
      }
      if (!bVar3) break;
      local_30 = local_30 + 1;
    }
    if (start < local_30) {
      return local_30 - start;
    }
  }
  return -1;
}

Assistant:

static int TextStartsWithWhitespace( Lexer *lexer, Node *node, uint start, uint mode )
{
    assert( node != NULL );
    if ( (mode & (CDATA|COMMENT)) && TY_(nodeIsTextLike)(node) && node->end > node->start && start >= node->start )
    {
        uint ch, ix = start;
        /* Skip whitespace. */
        while ( ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && ( ch==' ' || ch=='\t' || ch=='\r' ) )
            ++ix;

        if ( ix > start )
          return ix - start;
    }
    return -1;
}